

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImTriangulator::FlipNodeList(ImTriangulator *this)

{
  ImTriangulatorNode *pIVar1;
  ImTriangulatorNode *pIVar2;
  ImTriangulatorNode *pIVar3;
  ImTriangulatorNode *pIVar4;
  
  pIVar1 = this->_Nodes;
  pIVar2 = pIVar1->Next;
  pIVar1->Next = pIVar1;
  pIVar1->Prev = pIVar1;
  pIVar4 = pIVar1;
  while (pIVar2 != pIVar1) {
    pIVar3 = pIVar2->Next;
    pIVar2->Next = pIVar4;
    pIVar4->Prev = pIVar2;
    pIVar1->Next = pIVar2;
    pIVar2->Prev = pIVar1;
    pIVar4 = pIVar2;
    pIVar2 = pIVar3;
  }
  this->_Nodes = pIVar4;
  return;
}

Assistant:

void ImTriangulator::FlipNodeList()
{
    ImTriangulatorNode* prev = _Nodes;
    ImTriangulatorNode* temp = _Nodes;
    ImTriangulatorNode* current = _Nodes->Next;
    prev->Next = prev;
    prev->Prev = prev;
    while (current != _Nodes)
    {
        temp = current->Next;

        current->Next = prev;
        prev->Prev = current;
        _Nodes->Next = current;
        current->Prev = _Nodes;

        prev = current;
        current = temp;
    }
    _Nodes = prev;
}